

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O2

S2Cap * __thiscall
S2MinDistancePointTarget::GetCapBound(S2Cap *__return_storage_ptr__,S2MinDistancePointTarget *this)

{
  S1ChordAngle radius;
  
  radius = S1ChordAngle::Zero();
  S2Cap::S2Cap(__return_storage_ptr__,&this->point_,radius);
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2MinDistancePointTarget::GetCapBound() {
  return S2Cap(point_, S1ChordAngle::Zero());
}